

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O2

file_handle_type
mio::detail::open_file<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *path,access_mode mode,
          error_code *error)

{
  int iVar1;
  error_category *peVar2;
  error_code eVar3;
  
  std::error_code::clear(error);
  if (path->_M_string_length == 0) {
    iVar1 = 0x16;
    peVar2 = (error_category *)std::_V2::generic_category();
  }
  else {
    iVar1 = open((path->_M_dataplus)._M_p,(uint)(mode != read) * 2);
    if (iVar1 != -1) {
      return iVar1;
    }
    eVar3 = last_error();
    peVar2 = eVar3._M_cat;
    iVar1 = eVar3._M_value;
  }
  error->_M_value = iVar1;
  error->_M_cat = peVar2;
  return -1;
}

Assistant:

file_handle_type open_file(const String& path, const access_mode mode,
        std::error_code& error)
{
    error.clear();
    if(detail::empty(path))
    {
        error = std::make_error_code(std::errc::invalid_argument);
        return invalid_handle;
    }
#ifdef _WIN32
    const auto handle = win::open_file_helper(path, mode);
#else // POSIX
    const auto handle = ::open(c_str(path),
            mode == access_mode::read ? O_RDONLY : O_RDWR);
#endif
    if(handle == invalid_handle)
    {
        error = detail::last_error();
    }
    return handle;
}